

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

void Curl_ssl_detach_conn(Curl_easy *data,connectdata *conn)

{
  if (Curl_ssl->disassociate_connection != (_func_void_Curl_easy_ptr_int *)0x0) {
    (*Curl_ssl->disassociate_connection)(data,0);
    if ((conn->sock[1] != -1) && (((conn->bits).field_0x7 & 0x20) != 0)) {
      (*Curl_ssl->disassociate_connection)(data,1);
      return;
    }
  }
  return;
}

Assistant:

void Curl_ssl_detach_conn(struct Curl_easy *data,
                          struct connectdata *conn)
{
  if(Curl_ssl->disassociate_connection) {
    Curl_ssl->disassociate_connection(data, FIRSTSOCKET);
    if((conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) &&
       conn->bits.sock_accepted)
      Curl_ssl->disassociate_connection(data, SECONDARYSOCKET);
  }
}